

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

void __thiscall jessilib::io::formatted_message::~formatted_message(formatted_message *this)

{
  formatted_message *this_local;
  
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::~vector(&this->m_message);
  std::__cxx11::u8string::~u8string((u8string *)this);
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}